

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O2

int __thiscall CSound::Shutdown(CSound *this)

{
  SDL_CloseAudio();
  SDL_QuitSubSystem(0x10);
  lock_destroy(m_SoundLock);
  if (m_pMixBuffer != (int *)0x0) {
    mem_free(m_pMixBuffer);
    m_pMixBuffer = (int *)0x0;
  }
  return 0;
}

Assistant:

int CSound::Shutdown()
{
	SDL_CloseAudio();
	SDL_QuitSubSystem(SDL_INIT_AUDIO);
	lock_destroy(m_SoundLock);
	if(m_pMixBuffer)
	{
		mem_free(m_pMixBuffer);
		m_pMixBuffer = 0;
	}
	return 0;
}